

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLe
          (LightLeSample *__return_storage_ptr__,PortalImageInfiniteLight *this,Point2f *u1,
          Point2f *u2,SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar9 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar14 [48];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar27 [60];
  undefined1 auVar25 [64];
  undefined1 auVar28 [56];
  undefined1 auVar26 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  Vector3f VVar38;
  SampledSpectrum SVar39;
  Float mapPDF;
  Point2f uv;
  Float duv_dw;
  Bounds2f b;
  float local_e4;
  Tuple2<pbrt::Point2,_float> local_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  Bounds2f local_38;
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 auVar22 [56];
  
  auVar14 = in_ZmmResult._16_48_;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  local_38 = (Bounds2f)vmovlhps_avx(ZEXT816(0) << 0x40,auVar17);
  auVar19._0_8_ = WindowedPiecewiseConstant2D::Sample(&this->distribution,u1,&local_38,&local_e4);
  auVar19._8_56_ = extraout_var;
  auVar27 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
  local_e0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19._0_16_);
  if ((local_e4 == 0.0) && (!NAN(local_e4))) {
LAB_003ba954:
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
    *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
    __return_storage_ptr__->pdfPos = 0.0;
    __return_storage_ptr__->pdfDir = 0.0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    (__return_storage_ptr__->L).values.values[0] = 0.0;
    (__return_storage_ptr__->L).values.values[1] = 0.0;
    (__return_storage_ptr__->L).values.values[2] = 0.0;
    (__return_storage_ptr__->L).values.values[3] = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
    (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0
    ;
    return __return_storage_ptr__;
  }
  auVar22 = extraout_var;
  VVar38 = RenderFromImage(this,(Point2f *)&local_e0,&local_9c);
  auVar25._0_4_ = VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._4_60_ = auVar27;
  auVar20._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar22;
  auVar17 = auVar20._0_16_;
  if ((local_9c == 0.0) && (!NAN(local_9c))) goto LAB_003ba954;
  auVar24 = auVar25._0_16_;
  fVar32 = VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
  local_48._8_4_ = -auVar22._0_4_;
  local_48._12_4_ = -auVar22._4_4_;
  local_58 = -auVar25._0_4_;
  uStack_54 = auVar27._0_4_ ^ 0x80000000;
  uStack_50 = auVar27._4_4_ ^ 0x80000000;
  uStack_4c = auVar27._8_4_ ^ 0x80000000;
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vpternlogd_avx512vl(auVar8,auVar24,auVar6,0xf8);
  fVar23 = auVar6._0_4_;
  auVar29._0_4_ = -1.0 / (auVar25._0_4_ + fVar23);
  auVar9 = vmovshdup_avx(auVar17);
  auVar7._0_4_ = fVar32 * fVar32 * fVar23;
  auVar7._4_4_ = VVar38.super_Tuple3<pbrt::Vector3,_float>.y * 0.0;
  auVar7._8_4_ = auVar22._0_4_ * 0.0;
  auVar7._12_4_ = auVar22._4_4_ * 0.0;
  fVar16 = fVar32 * auVar9._0_4_ * auVar29._0_4_;
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  _local_d8 = ZEXT416((uint)(fVar23 * fVar16));
  auVar9 = vunpcklps_avx(auVar31,auVar6);
  auVar6 = vfmadd231ps_fma(auVar9,auVar7,auVar29);
  fVar15 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  fVar33 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
  auVar18._0_4_ = fVar15 + fVar15;
  auVar18._4_4_ = fVar33 + fVar33;
  auVar18._8_8_ = 0;
  auVar9._8_4_ = 0xbf800000;
  auVar9._0_8_ = 0xbf800000bf800000;
  auVar9._12_4_ = 0xbf800000;
  auVar7 = vaddps_avx512vl(auVar18,auVar9);
  fVar33 = auVar7._0_4_;
  auVar9 = vmovshdup_avx(auVar7);
  fVar15 = auVar9._0_4_;
  if (fVar33 == 0.0) {
    auVar18 = ZEXT816(0) << 0x20;
    if ((fVar15 == 0.0) && (auVar8 = ZEXT416((uint)fVar16), !NAN(fVar15))) goto LAB_003bab26;
  }
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar7,auVar4);
  auVar37._0_4_ = fVar33 / fVar15;
  auVar37._4_12_ = auVar7._4_12_;
  _local_d8 = ZEXT416((uint)(fVar23 * fVar16));
  local_68 = ZEXT416((uint)fVar16);
  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar37,ZEXT416(0x3fc90fdb));
  auVar7 = vshufps_avx(auVar8,auVar8,0xf5);
  bVar5 = auVar7._0_4_ < auVar8._0_4_;
  auVar11._16_48_ = auVar14;
  auVar11._0_16_ = auVar18;
  auVar10._4_60_ = auVar11._4_60_;
  auVar10._0_4_ =
       (float)((uint)bVar5 * (int)((fVar15 / fVar33) * 0.7853982) + (uint)!bVar5 * auVar18._0_4_);
  local_98 = auVar10._0_16_;
  auVar13._16_48_ = auVar14;
  auVar13._0_16_ = auVar9;
  auVar12._4_60_ = auVar13._4_60_;
  auVar12._0_4_ = (uint)bVar5 * (int)fVar33 + (uint)!bVar5 * (int)fVar15;
  local_88 = auVar12._0_16_;
  local_c8 = auVar24;
  local_b8 = auVar17;
  local_78 = auVar6;
  fVar15 = cosf(auVar10._0_4_);
  fVar16 = sinf((float)local_98._0_4_);
  auVar18 = vinsertps_avx(ZEXT416((uint)((float)local_88._0_4_ * fVar15)),
                          ZEXT416((uint)((float)local_88._0_4_ * fVar16)),0x10);
  auVar17 = local_b8;
  auVar8 = local_68;
  auVar6 = local_78;
  auVar24 = local_c8;
LAB_003bab26:
  fVar16 = auVar18._0_4_;
  fVar33 = auVar17._0_4_;
  auVar30._0_4_ = fVar33 * fVar16;
  fVar34 = auVar17._4_4_;
  auVar30._4_4_ = fVar34 * auVar18._4_4_;
  fVar35 = auVar17._8_4_;
  auVar30._8_4_ = fVar35 * auVar18._8_4_;
  fVar36 = auVar17._12_4_;
  auVar30._12_4_ = fVar36 * auVar18._12_4_;
  auVar17 = vmovshdup_avx(auVar30);
  fVar15 = this->sceneRadius;
  local_b8._0_4_ =
       auVar24._0_4_ * fVar15 +
       fVar15 * (auVar24._0_4_ * 0.0 + (fVar32 * -fVar23 * fVar16 - auVar17._0_4_)) +
       (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar9 = vpermt2ps_avx512vl(_local_d8,_DAT_00601610,auVar8);
  auVar17 = vshufps_avx(auVar18,auVar18,0xe1);
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar28 = (undefined1  [56])0x0;
  local_d8._4_4_ =
       fVar34 * fVar15 +
       (float)uVar3 +
       fVar15 * (fVar34 * 0.0 + auVar9._4_4_ * auVar17._4_4_ + auVar6._4_4_ * auVar18._4_4_);
  local_d8._0_4_ =
       fVar33 * fVar15 +
       (float)uVar1 + fVar15 * (fVar33 * 0.0 + auVar9._0_4_ * auVar17._0_4_ + auVar6._0_4_ * fVar16)
  ;
  fStack_d0 = fVar35 * fVar15 +
              fVar15 * (fVar35 * 0.0 + auVar9._8_4_ * auVar17._8_4_ + auVar6._8_4_ * auVar18._8_4_)
              + 0.0;
  fStack_cc = fVar36 * fVar15 +
              fVar15 * (fVar36 * 0.0 +
                       auVar9._12_4_ * auVar17._12_4_ + auVar6._12_4_ * auVar18._12_4_) + 0.0;
  auVar22 = ZEXT856(0);
  local_c8._0_4_ = 1.0 / (fVar15 * fVar15 * 3.1415927);
  SVar39 = ImageLookup(this,(Point2f *)&local_e0,lambda);
  auVar26._0_8_ = SVar39.values.values._8_8_;
  auVar26._8_56_ = auVar28;
  auVar21._0_8_ = SVar39.values.values._0_8_;
  auVar21._8_56_ = auVar22;
  auVar17 = vmovlhps_avx(auVar21._0_16_,auVar26._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar17;
  uVar2 = vmovlps_avx(_local_d8);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_b8._0_4_;
  uVar2 = vmovlps_avx(local_48);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = local_58;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = (Float)local_c8._0_4_;
  __return_storage_ptr__->pdfDir = local_e4 / local_9c;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample PortalImageInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                                 SampledWavelengths &lambda,
                                                 Float time) const {
    Float mapPDF;
    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Point2f uv = distribution.Sample(u1, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f w = -RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdfDir = mapPDF / duv_dw;

#if 0
    // Just sample within the portal.
    // This works with the light path integrator, but not BDPT :-(
    Point3f p = portal[0] + u2[0] * (portal[1] - portal[0]) +
        u2[1] * (portal[3] - portal[0]);
    // Compute _PortalImageInfiniteLight_ ray PDFs
    Ray ray(p, w, time);

    // Cosine to account for projected area of portal w.r.t. ray direction.
    Normal3f n = Normal3f(portalFrame.z);
    Float pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLeSample(L, ray, pdfPos, pdfDir);
}